

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QCss::ImportRule>::emplace<QCss::ImportRule_const&>
          (QMovableArrayOps<QCss::ImportRule> *this,qsizetype i,ImportRule *args)

{
  qsizetype *pqVar1;
  ImportRule **ppIVar2;
  ImportRule *pIVar3;
  Data *pDVar4;
  long lVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  ImportRule *pIVar9;
  Data *pDVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QArrayDataPointer<QString> QStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::ImportRule>).
           super_QArrayDataPointer<QCss::ImportRule>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_005f6e2a:
    pDVar6 = (args->href).d.d;
    pcVar7 = (args->href).d.ptr;
    qVar8 = (args->href).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    QStack_50.d = (args->media).d.d;
    QStack_50.ptr = (args->media).d.ptr;
    QStack_50.size = (args->media).d.size;
    if (QStack_50.d != (Data *)0x0) {
      LOCK();
      ((QStack_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar11 = (this->super_QGenericArrayOps<QCss::ImportRule>).
             super_QArrayDataPointer<QCss::ImportRule>.size != 0;
    QArrayDataPointer<QCss::ImportRule>::detachAndGrow
              ((QArrayDataPointer<QCss::ImportRule> *)this,(uint)(i == 0 && bVar11),1,
               (ImportRule **)0x0,(QArrayDataPointer<QCss::ImportRule> *)0x0);
    pIVar9 = (this->super_QGenericArrayOps<QCss::ImportRule>).
             super_QArrayDataPointer<QCss::ImportRule>.ptr;
    if (i == 0 && bVar11) {
      pIVar9[-1].href.d.d = pDVar6;
      pIVar9[-1].href.d.ptr = pcVar7;
      pIVar9[-1].href.d.size = qVar8;
      pIVar9[-1].media.d.d = QStack_50.d;
      pIVar9[-1].media.d.ptr = QStack_50.ptr;
      pIVar9[-1].media.d.size = QStack_50.size;
      (this->super_QGenericArrayOps<QCss::ImportRule>).super_QArrayDataPointer<QCss::ImportRule>.ptr
           = pIVar9 + -1;
    }
    else {
      pIVar3 = pIVar9 + i;
      memmove(pIVar3 + 1,pIVar9 + i,
              ((this->super_QGenericArrayOps<QCss::ImportRule>).
               super_QArrayDataPointer<QCss::ImportRule>.size - i) * 0x30);
      (pIVar3->href).d.d = pDVar6;
      (pIVar3->href).d.ptr = pcVar7;
      (pIVar3->href).d.size = qVar8;
      (pIVar3->media).d.d = QStack_50.d;
      (pIVar3->media).d.ptr = QStack_50.ptr;
      (pIVar3->media).d.size = QStack_50.size;
    }
    QStack_50.size = 0;
    QStack_50.ptr = (QString *)0x0;
    QStack_50.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QCss::ImportRule>).
              super_QArrayDataPointer<QCss::ImportRule>.size;
    *pqVar1 = *pqVar1 + 1;
    QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_50);
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<QCss::ImportRule>).
            super_QArrayDataPointer<QCss::ImportRule>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<QCss::ImportRule>).
                      super_QArrayDataPointer<QCss::ImportRule>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pIVar9 = (this->super_QGenericArrayOps<QCss::ImportRule>).
               super_QArrayDataPointer<QCss::ImportRule>.ptr;
      pDVar6 = (args->href).d.d;
      pIVar9[lVar5].href.d.d = pDVar6;
      pIVar9[lVar5].href.d.ptr = (args->href).d.ptr;
      pIVar9[lVar5].href.d.size = (args->href).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar10 = (args->media).d.d;
      pIVar9[lVar5].media.d.d = pDVar10;
      pIVar9[lVar5].media.d.ptr = (args->media).d.ptr;
      pIVar9[lVar5].media.d.size = (args->media).d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((ImportRule *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QGenericArrayOps<QCss::ImportRule>).
             super_QArrayDataPointer<QCss::ImportRule>.ptr)) goto LAB_005f6e2a;
      pIVar9 = (this->super_QGenericArrayOps<QCss::ImportRule>).
               super_QArrayDataPointer<QCss::ImportRule>.ptr;
      pDVar6 = (args->href).d.d;
      pIVar9[-1].href.d.d = pDVar6;
      pIVar9[-1].href.d.ptr = (args->href).d.ptr;
      pIVar9[-1].href.d.size = (args->href).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar10 = (args->media).d.d;
      pIVar9[-1].media.d.d = pDVar10;
      pIVar9[-1].media.d.ptr = (args->media).d.ptr;
      pIVar9[-1].media.d.size = (args->media).d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppIVar2 = &(this->super_QGenericArrayOps<QCss::ImportRule>).
                 super_QArrayDataPointer<QCss::ImportRule>.ptr;
      *ppIVar2 = *ppIVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCss::ImportRule>).
              super_QArrayDataPointer<QCss::ImportRule>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }